

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vfs_register(sqlite3_vfs *pVfs,int makeDflt)

{
  int in_ESI;
  sqlite3_vfs *in_RDI;
  int rc;
  sqlite3_mutex *mutex;
  int local_4;
  
  local_4 = sqlite3_initialize();
  if (local_4 == 0) {
    sqlite3MutexAlloc(0);
    sqlite3_mutex_enter((sqlite3_mutex *)0x132af6);
    vfsUnlink(in_RDI);
    if ((in_ESI == 0) && (vfsList != (sqlite3_vfs *)0x0)) {
      in_RDI->pNext = vfsList->pNext;
      vfsList->pNext = in_RDI;
    }
    else {
      in_RDI->pNext = vfsList;
      vfsList = in_RDI;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x132b5d);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SQLITE_API int sqlite3_vfs_register(sqlite3_vfs *pVfs, int makeDflt){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pVfs==0 ) return SQLITE_MISUSE_BKPT;
#endif

  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  if( makeDflt || vfsList==0 ){
    pVfs->pNext = vfsList;
    vfsList = pVfs;
  }else{
    pVfs->pNext = vfsList->pNext;
    vfsList->pNext = pVfs;
  }
  assert(vfsList);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}